

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool duckdb_snappy::RawUncompress(Source *compressed,char *uncompressed)

{
  bool bVar1;
  uint32_t in_ECX;
  SnappyArrayWriter output;
  SnappyDecompressor decompressor;
  uint32_t local_5c;
  SnappyArrayWriter local_58;
  SnappyDecompressor local_38;
  
  local_38.peeked_ = 0;
  local_38.eof_ = false;
  local_38.ip_ = (char *)0x0;
  local_38.ip_limit_ = (char *)0x0;
  local_5c = 0;
  local_58.base_ = uncompressed;
  local_58.op_ = uncompressed;
  local_58.op_limit_ = uncompressed;
  local_58.op_limit_min_slop_ = uncompressed;
  local_38.reader_ = compressed;
  bVar1 = SnappyDecompressor::ReadUncompressedLength(&local_38,&local_5c);
  if (bVar1) {
    (*compressed->_vptr_Source[2])(compressed);
    bVar1 = InternalUncompressAllTags<duckdb_snappy::SnappyArrayWriter>
                      (&local_38,&local_58,local_5c,in_ECX);
  }
  else {
    bVar1 = false;
  }
  SnappyDecompressor::~SnappyDecompressor(&local_38);
  return bVar1;
}

Assistant:

bool RawUncompress(Source* compressed, char* uncompressed) {
  SnappyArrayWriter output(uncompressed);
  return InternalUncompress(compressed, &output);
}